

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

bool __thiscall LinearNE<0,_1,_0>::propagate(LinearNE<0,_1,_0> *this)

{
  long *plVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  Lit *pLVar6;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  Clause *local_40;
  
  if ((this->num_unfixed).v == 0) {
    if ((this->sum_fixed).v != 0) {
      return true;
    }
    if (so.lazy) {
      r._pt = Reason_new(this->sz + 1);
      lVar9 = 0;
      lVar12 = 0;
      while (lVar12 < this->sz) {
        iVar4 = (**(code **)(**(long **)((long)&this->x->var + lVar9) + 0x50))();
        lVar12 = lVar12 + 1;
        pLVar6 = Clause::operator[](r._pt,(int)lVar12);
        pLVar6->x = iVar4;
        lVar9 = lVar9 + 0x10;
      }
    }
    else {
      r._pt = (Clause *)0x0;
    }
    bVar2 = BoolView::setVal(&this->r,false,(Reason)r);
    return bVar2;
  }
  uVar10 = 0;
  lVar9 = 0;
  do {
    lVar8 = lVar9;
    lVar12 = *(long *)((long)&this->x->var + lVar8);
    lVar9 = lVar8 + 0x10;
    uVar10 = uVar10 - 1;
  } while (*(int *)(lVar12 + 0xc) == *(int *)(lVar12 + 0x10));
  iVar4 = *(int *)&(this->super_Propagator).field_0x14;
  iVar11 = (int)~uVar10;
  if (iVar11 < iVar4) {
    bVar2 = IntView<0>::indomain((IntView<0> *)((long)&this->x->var + lVar8),-(this->sum_fixed).v);
    if (bVar2) goto LAB_00188035;
    iVar4 = *(int *)&(this->super_Propagator).field_0x14;
  }
  if (iVar11 < iVar4) {
    return true;
  }
  bVar2 = IntView<1>::indomain((IntView<1> *)((long)&this->y->var + lVar8),-(this->sum_fixed).v);
  if (!bVar2) {
    return true;
  }
LAB_00188035:
  if (so.lazy == true) {
    local_40 = Reason_new(this->sz);
    lVar12 = 0;
    uVar7 = 0;
    while (~uVar10 != uVar7) {
      iVar4 = (**(code **)(**(long **)((long)&this->x->var + lVar12) + 0x50))();
      uVar7 = uVar7 + 1;
      pLVar6 = Clause::operator[](local_40,(int)uVar7);
      pLVar6->x = iVar4;
      lVar12 = lVar12 + 0x10;
    }
    for (iVar4 = -(int)uVar10; iVar4 < this->sz; iVar4 = iVar4 + 1) {
      iVar5 = (**(code **)(**(long **)((long)&this->x->var + lVar9) + 0x50))();
      pLVar6 = Clause::operator[](local_40,iVar4);
      pLVar6->x = iVar5;
      lVar9 = lVar9 + 0x10;
    }
  }
  else {
    local_40 = (Clause *)0x0;
  }
  if (iVar11 < *(int *)&(this->super_Propagator).field_0x14) {
    plVar1 = *(long **)((long)&this->x->var + lVar8);
    cVar3 = (**(code **)(*plVar1 + 0x88))(plVar1,-(this->sum_fixed).v,local_40,1);
    if (cVar3 == '\0') {
      return false;
    }
  }
  else {
    plVar1 = *(long **)((long)&this->y->var + lVar8);
    cVar3 = (**(code **)(*plVar1 + 0x88))(plVar1,(this->sum_fixed).v,local_40,1);
    if (cVar3 == '\0') {
      return false;
    }
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		assert(num_unfixed <= 1);

		if (num_unfixed == 0) {
			if (sum_fixed == 0) {
				Clause* m_r = nullptr;
				if (so.lazy) {
					m_r = Reason_new(sz + 1);
					for (int i = 0; i < sz; i++) {
						(*m_r)[i + 1] = x[i].getValLit();
					}
				}
				return r.setVal(false, m_r);
			}
			return true;
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		assert(num_unfixed == 1);

		int k = 0;
		while (x[k].isFixed()) {
			k++;
		}
		assert(k < sz);
		for (int i = k + 1; i < sz; i++) {
			assert(x[i].isFixed());
		}

		if ((k < sp && x[k].remValNotR(-sum_fixed)) || (k >= sp && y[k].remValNotR(-sum_fixed))) {
			Clause* m_r = nullptr;
			if (so.lazy) {
				m_r = Reason_new(sz + R);
				for (int i = 0; i < k; i++) {
					(*m_r)[i + 1] = x[i].getValLit();
				}
				for (int i = k + 1; i < sz; i++) {
					(*m_r)[i] = x[i].getValLit();
				}
				if (R != 0) {
					(*m_r)[sz] = r.getValLit();
				}
			}
			if (k < sp) {
				if (!x[k].remVal(-sum_fixed, m_r)) {
					return false;
				}
			} else {
				if (!y[k].remVal(-sum_fixed, m_r)) {
					return false;
				}
			}
		}

		return true;
	}